

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitSIMDExtract(PrintExpressionContents *this,SIMDExtract *curr)

{
  ostream *this_00;
  
  prepareColor(this->o);
  if ((ulong)curr->op < 9) {
    std::operator<<(this->o,&DAT_00e240ec + *(int *)(&DAT_00e240ec + (ulong)curr->op * 4));
  }
  Colors::normal(this->o);
  this_00 = std::operator<<(this->o," ");
  std::ostream::operator<<(this_00,(uint)curr->index);
  return;
}

Assistant:

void visitSIMDExtract(SIMDExtract* curr) {
    prepareColor(o);
    switch (curr->op) {
      case ExtractLaneSVecI8x16:
        o << "i8x16.extract_lane_s";
        break;
      case ExtractLaneUVecI8x16:
        o << "i8x16.extract_lane_u";
        break;
      case ExtractLaneSVecI16x8:
        o << "i16x8.extract_lane_s";
        break;
      case ExtractLaneUVecI16x8:
        o << "i16x8.extract_lane_u";
        break;
      case ExtractLaneVecI32x4:
        o << "i32x4.extract_lane";
        break;
      case ExtractLaneVecI64x2:
        o << "i64x2.extract_lane";
        break;
      case ExtractLaneVecF16x8:
        o << "f16x8.extract_lane";
        break;
      case ExtractLaneVecF32x4:
        o << "f32x4.extract_lane";
        break;
      case ExtractLaneVecF64x2:
        o << "f64x2.extract_lane";
        break;
    }
    restoreNormalColor(o);
    o << " " << int(curr->index);
  }